

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

int uudecode_read_header(archive_read_filter *self,archive_entry *entry)

{
  void *pvVar1;
  
  pvVar1 = self->data;
  if (*(int *)((long)pvVar1 + 0x30) != 0) {
    archive_entry_set_mode(entry,*(uint *)((long)pvVar1 + 0x2c) | 0x8000);
  }
  if (*(char **)((long)pvVar1 + 0x38) != (char *)0x0) {
    archive_entry_set_pathname(entry,*(char **)((long)pvVar1 + 0x38));
  }
  return 0;
}

Assistant:

static int
uudecode_read_header(struct archive_read_filter *self, struct archive_entry *entry)
{

	struct uudecode *uudecode;
	uudecode = (struct uudecode *)self->data;

	if (uudecode->mode_set != 0)
		archive_entry_set_mode(entry, S_IFREG | uudecode->mode);

	if (uudecode->name != NULL)
		archive_entry_set_pathname(entry, uudecode->name);

	return (ARCHIVE_OK);
}